

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

int32_t __thiscall icu_63::OffsetList::popMinimum(OffsetList *this)

{
  int iVar1;
  int iVar2;
  UBool *pUVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  iVar1 = this->start;
  lVar5 = (long)iVar1;
  iVar2 = this->capacity;
  pUVar3 = this->list;
  iVar6 = iVar1;
  do {
    lVar5 = lVar5 + 1;
    if (iVar2 <= lVar5) {
      lVar5 = -1;
      do {
        lVar4 = lVar5 + 1;
        lVar5 = lVar5 + 1;
      } while (pUVar3[lVar4] == '\0');
      pUVar3[lVar5] = '\0';
      this->length = this->length + -1;
      this->start = (int)lVar5;
      return (iVar2 - iVar1) + (int)lVar5;
    }
    iVar6 = iVar6 + 1;
  } while (pUVar3[lVar5] == '\0');
  pUVar3[lVar5] = '\0';
  this->length = this->length + -1;
  iVar1 = this->start;
  this->start = iVar6;
  return iVar6 - iVar1;
}

Assistant:

int32_t popMinimum() {
        // Look for the next offset in list[start+1..capacity-1].
        int32_t i=start, result;
        while(++i<capacity) {
            if(list[i]) {
                list[i]=FALSE;
                --length;
                result=i-start;
                start=i;
                return result;
            }
        }
        // i==capacity

        // Wrap around and look for the next offset in list[0..start].
        // Since the list is not empty, there will be one.
        result=capacity-start;
        i=0;
        while(!list[i]) {
            ++i;
        }
        list[i]=FALSE;
        --length;
        start=i;
        return result+=i;
    }